

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O1

void t42_parse_sfnts(T42_Face face,T42_Loader loader)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  FT_Byte *pFVar4;
  FT_Byte **ppFVar5;
  FT_Error FVar6;
  uint uVar7;
  FT_Byte *pFVar8;
  FT_Memory new_count;
  FT_Memory cur_count;
  ulong uVar9;
  int iVar10;
  undefined4 uVar11;
  long lVar12;
  ulong uVar13;
  FT_Long FVar14;
  FT_Byte **ppFVar15;
  FT_Memory pFVar16;
  ulong uVar17;
  bool bVar18;
  FT_Error error;
  FT_ULong real_size;
  FT_Error local_84;
  FT_Memory local_80;
  undefined4 local_74;
  FT_Byte *local_70;
  FT_Byte **local_68;
  ulong local_60;
  uint local_54;
  byte *local_50;
  FT_Offset local_48;
  T42_Face local_40;
  ulong local_38;
  
  pbVar2 = (loader->parser).root.limit;
  pFVar16 = (loader->parser).root.memory;
  ppFVar15 = &face->ttf_data;
  ft_mem_free(pFVar16,face->ttf_data);
  face->ttf_data = (FT_Byte *)0x0;
  face->ttf_size = 0;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pbVar3 = (loader->parser).root.cursor;
  local_50 = pbVar2;
  if ((pbVar3 < pbVar2) && ((loader->parser).root.cursor = pbVar3 + 1, *pbVar3 == 0x5b)) {
    local_40 = face;
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    pFVar8 = (FT_Byte *)ft_mem_qalloc(pFVar16,0xc,&local_84);
    *ppFVar15 = pFVar8;
    iVar10 = 0;
    if (local_84 != 0) goto LAB_002690f9;
    pFVar8 = (FT_Byte *)0x0;
    local_74 = 0;
    local_48 = 0;
    uVar13 = 0;
    FVar14 = 0;
    local_54 = 0;
    new_count = (FT_Memory)0xc;
    local_68 = ppFVar15;
    do {
      pbVar2 = (loader->parser).root.cursor;
      if (local_50 <= pbVar2) {
        local_84 = 3;
        uVar11 = local_74;
        goto LAB_002690fe;
      }
      bVar1 = *pbVar2;
      if (bVar1 == 0x3c) {
        if ((char)local_74 == '\0' && pFVar8 != (FT_Byte *)0x0) {
          local_84 = 3;
          FVar6 = 6;
          local_74 = 0;
        }
        else {
          local_80 = new_count;
          local_70 = pFVar8;
          local_60 = uVar13;
          (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
          FVar6 = 0xd;
          new_count = local_80;
          pFVar8 = local_70;
          uVar13 = local_60;
          if ((loader->parser).root.error == 0) {
            pFVar4 = (loader->parser).root.cursor;
            if ((ulong)((long)pFVar4 - (long)pbVar2) < 3) {
              local_84 = 3;
              FVar6 = 6;
              uVar13 = 0;
            }
            else {
              local_60 = (long)(pFVar4 + ~(ulong)pbVar2) / 2;
              pFVar8 = (FT_Byte *)ft_mem_qrealloc(pFVar16,1,local_48,local_60,local_70,&local_84);
              uVar13 = local_60;
              FVar6 = 6;
              new_count = local_80;
              if (local_84 == 0) {
                (loader->parser).root.cursor = pbVar2;
                local_70 = pFVar8;
                FVar6 = (*(loader->parser).root.funcs.to_bytes)
                                  ((PS_Parser)loader,pFVar8,local_60,&local_38,'\x01');
                local_74 = (undefined4)CONCAT71((uint7)(uint3)((uint)FVar6 >> 8),1);
                local_48 = uVar13;
                new_count = local_80;
                pFVar8 = local_70;
                uVar13 = local_38;
                goto LAB_00268ea5;
              }
            }
          }
        }
      }
      else if (bVar1 == 0x5d) {
        (loader->parser).root.cursor = pbVar2 + 1;
        local_40->ttf_size = FVar14;
        FVar6 = 0xd;
      }
      else {
        if (bVar1 - 0x30 < 10) {
          if ((char)local_74 == '\0') {
            local_80 = new_count;
            local_70 = pFVar8;
            uVar9 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
            if ((long)uVar9 < 0) {
              local_84 = 3;
              FVar6 = 6;
              uVar9 = uVar13;
            }
            else {
              (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
              if ((loader->parser).root.error == 0) {
                pFVar4 = (loader->parser).root.cursor;
                pFVar8 = pFVar4 + 1;
                bVar18 = (ulong)((long)local_50 - (long)pFVar4) <= uVar9;
                if (bVar18) {
                  local_84 = 3;
                  FVar6 = 6;
                }
                else {
                  (loader->parser).root.cursor = pFVar4 + uVar9 + 1;
                  FVar6 = 0;
                }
                bVar18 = !bVar18;
                new_count = local_80;
                ppFVar15 = local_68;
                goto LAB_00268e9d;
              }
              FVar6 = 1;
            }
            bVar18 = false;
            new_count = local_80;
            pFVar8 = local_70;
            ppFVar15 = local_68;
          }
          else {
            local_84 = 3;
            FVar6 = 6;
            bVar18 = false;
            uVar9 = uVar13;
          }
LAB_00268e9d:
          uVar13 = uVar9;
          if (!bVar18) goto LAB_002690d9;
        }
LAB_00268ea5:
        if (pFVar8 == (FT_Byte *)0x0) {
          local_84 = 3;
          FVar6 = 6;
          pFVar8 = (FT_Byte *)0x0;
        }
        else {
          if (((uVar13 & 1) != 0) && (pFVar8[uVar13 - 1] == '\0')) {
            uVar13 = uVar13 - 1;
          }
          if (uVar13 == 0) {
            local_84 = 3;
            FVar6 = 6;
            uVar13 = 0;
          }
          else {
            uVar17 = (long)local_50 - (long)(loader->parser).root.cursor;
            uVar9 = 0;
            cur_count = new_count;
            local_80 = pFVar16;
            local_70 = pFVar8;
            local_60 = uVar13;
            do {
              new_count = cur_count;
              if (iVar10 == 2) {
LAB_0026904c:
                ppFVar15 = local_68;
                if ((long)new_count <= FVar14) {
                  local_84 = 3;
                  FVar6 = 6;
                  pFVar16 = local_80;
                  goto LAB_002690d9;
                }
              }
              else if (iVar10 == 1) {
LAB_00268f87:
                ppFVar5 = local_68;
                iVar10 = 1;
                if ((long)new_count <= FVar14) {
                  pFVar16 = new_count;
                  if (0 < (int)local_54) {
                    lVar12 = 0;
                    do {
                      uVar7 = *(uint *)(*local_68 + lVar12 + 0x18);
                      uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                              uVar7 << 0x18;
                      if ((long)(uVar17 - uVar7) < (long)pFVar16 || uVar17 < uVar7) {
                        local_84 = 3;
                        FVar6 = 6;
                        iVar10 = 1;
                        new_count = pFVar16;
                        goto LAB_00269044;
                      }
                      pFVar16 = (FT_Memory)((long)&pFVar16->user + (ulong)(uVar7 + 3 & 0xfffffffc));
                      lVar12 = lVar12 + 0x10;
                    } while ((ulong)local_54 << 4 != lVar12);
                  }
                  pFVar16 = (FT_Memory)((long)&pFVar16->user + 1);
                  pFVar8 = (FT_Byte *)
                           ft_mem_qrealloc(local_80,1,(FT_Long)new_count,(FT_Long)pFVar16,*local_68,
                                           &local_84);
                  *ppFVar5 = pFVar8;
                  FVar6 = local_84;
                  if (local_84 != 0) {
                    FVar6 = 6;
                  }
                  iVar10 = 2;
                  pFVar8 = local_70;
                  uVar13 = local_60;
                  new_count = pFVar16;
LAB_00269044:
                  ppFVar15 = local_68;
                  pFVar16 = local_80;
                  if (FVar6 == 0) goto LAB_0026904c;
                  goto LAB_002690d9;
                }
              }
              else {
                iVar10 = 0;
                if (0xb < FVar14) {
                  pFVar4 = *ppFVar15;
                  local_54 = (uint)pFVar4[5] + (uint)pFVar4[4] * 0x10;
                  new_count = (FT_Memory)(ulong)(local_54 * 0x10 | 0xc);
                  if ((long)uVar17 < (long)new_count) {
                    local_84 = 3;
                    bVar18 = false;
                    FVar6 = 6;
                  }
                  else {
                    pFVar8 = (FT_Byte *)
                             ft_mem_qrealloc(local_80,1,(FT_Long)cur_count,(FT_Long)new_count,pFVar4
                                             ,&local_84);
                    *ppFVar15 = pFVar8;
                    bVar18 = local_84 == 0;
                    pFVar8 = local_70;
                    uVar13 = local_60;
                    FVar6 = local_84;
                    if (!bVar18) {
                      FVar6 = 6;
                    }
                  }
                  ppFVar15 = local_68;
                  if (bVar18) goto LAB_00268f87;
                  iVar10 = 1;
                  pFVar16 = local_80;
                  goto LAB_002690d9;
                }
              }
              (*ppFVar15)[FVar14] = pFVar8[uVar9];
              FVar14 = FVar14 + 1;
              uVar9 = uVar9 + 1;
              cur_count = new_count;
            } while (uVar9 != uVar13);
            (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
            FVar6 = 0;
            pFVar8 = local_70;
            uVar13 = local_60;
            pFVar16 = local_80;
          }
        }
      }
LAB_002690d9:
    } while (FVar6 == 0);
    uVar11 = local_74;
    if (FVar6 != 6) {
      if (FVar6 != 0xd) {
        return;
      }
      goto LAB_00269106;
    }
  }
  else {
    local_84 = 3;
LAB_002690f9:
    pFVar8 = (FT_Byte *)0x0;
    uVar11 = 0;
  }
LAB_002690fe:
  (loader->parser).root.error = local_84;
LAB_00269106:
  if ((loader->parser).root.error != 0) {
    ft_mem_free(pFVar16,*ppFVar15);
    *ppFVar15 = (FT_Byte *)0x0;
    ppFVar15[1] = (FT_Byte *)0x0;
  }
  if ((char)uVar11 != '\0') {
    ft_mem_free(pFVar16,pFVar8);
  }
  return;
}

Assistant:

static void
  t42_parse_sfnts( T42_Face    face,
                   T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Memory   memory = parser->root.memory;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;
    FT_Error    error;
    FT_Int      num_tables = 0;
    FT_Long     ttf_count;
    FT_Long     ttf_reserved;

    FT_ULong    n, string_size, old_string_size, real_size;
    FT_Byte*    string_buf = NULL;
    FT_Bool     allocated  = 0;

    T42_Load_Status  status;

    /** There should only be one sfnts array, but free any previous. */
    FT_FREE( face->ttf_data );
    face->ttf_size = 0;

    /* The format is                                */
    /*                                              */
    /*   /sfnts [ <hexstring> <hexstring> ... ] def */
    /*                                              */
    /* or                                           */
    /*                                              */
    /*   /sfnts [                                   */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      ...                                     */
    /*   ] def                                      */
    /*                                              */
    /* with exactly one space after the `RD' token. */

    T1_Skip_Spaces( parser );

    if ( parser->root.cursor >= limit || *parser->root.cursor++ != '[' )
    {
      FT_ERROR(( "t42_parse_sfnts: can't find begin of sfnts vector\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    T1_Skip_Spaces( parser );
    status          = BEFORE_START;
    string_size     = 0;
    old_string_size = 0;
    ttf_count       = 0;
    ttf_reserved    = 12;
    if ( FT_QALLOC( face->ttf_data, ttf_reserved ) )
      goto Fail;

    FT_TRACE2(( "\n" ));
    FT_TRACE2(( "t42_parse_sfnts:\n" ));

    while ( parser->root.cursor < limit )
    {
      FT_ULong  size;


      cur = parser->root.cursor;

      if ( *cur == ']' )
      {
        parser->root.cursor++;
        face->ttf_size = ttf_count;
        goto Exit;
      }

      else if ( *cur == '<' )
      {
        if ( string_buf && !allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        /* don't include delimiters */
        string_size = (FT_ULong)( ( parser->root.cursor - cur - 2 + 1 ) / 2 );
        if ( !string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        if ( FT_QREALLOC( string_buf, old_string_size, string_size ) )
          goto Fail;

        allocated = 1;

        parser->root.cursor = cur;
        (void)T1_ToBytes( parser, string_buf, string_size, &real_size, 1 );
        old_string_size = string_size;
        string_size     = real_size;
      }

      else if ( ft_isdigit( *cur ) )
      {
        FT_Long  tmp;


        if ( allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        tmp = T1_ToInt( parser );
        if ( tmp < 0 )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid string size\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          string_size = (FT_ULong)tmp;

        T1_Skip_PS_Token( parser );             /* `RD' */
        if ( parser->root.error )
          return;

        string_buf = parser->root.cursor + 1;   /* one space after `RD' */

        if ( (FT_ULong)( limit - parser->root.cursor ) <= string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          parser->root.cursor += string_size + 1;
      }

      if ( !string_buf )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* A string can have a trailing zero (odd) byte for padding. */
      /* Ignore it.                                                */
      if ( ( string_size & 1 ) && string_buf[string_size - 1] == 0 )
        string_size--;

      if ( !string_size )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid string\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      FT_TRACE2(( "  PS string size %5lu bytes, offset 0x%08lx (%lu)\n",
                  string_size, ttf_count, ttf_count ));

      /* The whole TTF is now loaded into `string_buf'.  We are */
      /* checking its contents while copying it to `ttf_data'.  */

      size = (FT_ULong)( limit - parser->root.cursor );

      for ( n = 0; n < string_size; n++ )
      {
        switch ( status )
        {
        case BEFORE_START:
          /* load offset table, 12 bytes */
          if ( ttf_count < 12 )
          {
            face->ttf_data[ttf_count++] = string_buf[n];
            continue;
          }
          else
          {
            FT_Long ttf_reserved_prev = ttf_reserved;


            num_tables   = 16 * face->ttf_data[4] + face->ttf_data[5];
            status       = BEFORE_TABLE_DIR;
            ttf_reserved = 12 + 16 * num_tables;

            FT_TRACE2(( "  SFNT directory contains %d tables\n",
                        num_tables ));

            if ( (FT_Long)size < ttf_reserved )
            {
              FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
              error = FT_THROW( Invalid_File_Format );
              goto Fail;
            }

            if ( FT_QREALLOC( face->ttf_data, ttf_reserved_prev,
                              ttf_reserved ) )
              goto Fail;
          }
          FALL_THROUGH;

        case BEFORE_TABLE_DIR:
          /* the offset table is read; read the table directory */
          if ( ttf_count < ttf_reserved )
          {
            face->ttf_data[ttf_count++] = string_buf[n];
            continue;
          }
          else
          {
            int       i;
            FT_ULong  len;
            FT_Long ttf_reserved_prev = ttf_reserved;


            FT_TRACE2(( "\n" ));
            FT_TRACE2(( "  table    length\n" ));
            FT_TRACE2(( "  ------------------------------\n" ));

            for ( i = 0; i < num_tables; i++ )
            {
              FT_Byte*  p = face->ttf_data + 12 + 16 * i + 12;


              len = FT_PEEK_ULONG( p );
              FT_TRACE2(( "   %4i  0x%08lx (%lu)\n", i, len, len ));

              if ( len > size                               ||
                   ttf_reserved > (FT_Long)( size - len ) )
              {
                FT_ERROR(( "t42_parse_sfnts:"
                           " invalid data in sfnts array\n" ));
                error = FT_THROW( Invalid_File_Format );
                goto Fail;
              }

              /* Pad to a 4-byte boundary length */
              ttf_reserved += (FT_Long)( ( len + 3 ) & ~3U );
            }
            ttf_reserved += 1;

            status = OTHER_TABLES;

            FT_TRACE2(( "\n" ));
            FT_TRACE2(( "  allocating %ld bytes\n", ttf_reserved ));
            FT_TRACE2(( "\n" ));

            if ( FT_QREALLOC( face->ttf_data, ttf_reserved_prev,
                              ttf_reserved ) )
              goto Fail;
          }
          FALL_THROUGH;

        case OTHER_TABLES:
          /* all other tables are just copied */
          if ( ttf_count >= ttf_reserved )
          {
            FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }
          face->ttf_data[ttf_count++] = string_buf[n];
        }
      }

      T1_Skip_Spaces( parser );
    }

    /* if control reaches this point, the format was not valid */
    error = FT_THROW( Invalid_File_Format );

  Fail:
    parser->root.error = error;

  Exit:
    if ( parser->root.error )
    {
      FT_FREE( face->ttf_data );
      face->ttf_size = 0;
    }
    if ( allocated )
      FT_FREE( string_buf );
  }